

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void * __thiscall
google::protobuf::internal::ThreadSafeArena::AllocateAlignedWithCleanup
          (ThreadSafeArena *this,size_t n,size_t align,_func_void_void_ptr *destructor)

{
  __pointer_type pAVar1;
  __pointer_type pcVar2;
  long lVar3;
  ArenaAlign AVar4;
  CleanupNode *pCVar5;
  CleanupNode *extraout_RAX;
  CleanupNode *pCVar6;
  SerialArena *pSVar7;
  CleanupNode *pCVar8;
  string *psVar9;
  CleanupNode *destructor_00;
  undefined8 uVar10;
  size_t align_00;
  undefined8 uVar11;
  CleanupNode *pCVar12;
  __pointer_type pAVar13;
  ThreadSafeArena *this_00;
  __pointer_type pAVar14;
  char *pcVar15;
  ulong n_00;
  CleanupNode *pCVar16;
  void *pvVar17;
  LogMessageFatal aLStack_88 [16];
  SerialArena *pSStack_78;
  size_t sStack_70;
  ulong uStack_68;
  CleanupNode *pCStack_60;
  _func_void_void_ptr *p_Stack_58;
  CleanupNode *pCStack_50;
  
  pCStack_50 = (CleanupNode *)0x136012;
  pCVar8 = (CleanupNode *)n;
  lVar3 = __tls_get_addr(&PTR_001b3f20);
  if (*(uint64_t *)(lVar3 + 8) != this->tag_and_id_) {
    pvVar17 = AllocateAlignedWithCleanupFallback(this,n,align,destructor);
    return pvVar17;
  }
  pSVar7 = *(SerialArena **)(lVar3 + 0x10);
  pCStack_50 = (CleanupNode *)0x13602b;
  AVar4 = ArenaAlignAs(align);
  pcVar2 = (pSVar7->ptr_)._M_b._M_p;
  if (((ulong)pcVar2 & 7) != 0) {
    pCStack_50 = (CleanupNode *)0x136122;
    AllocateAlignedWithCleanup();
LAB_00136122:
    pvVar17 = SerialArena::AllocateAlignedWithCleanupFallback(pSVar7,n,align,destructor);
    return pvVar17;
  }
  n = n + 7 & 0xfffffffffffffff8;
  pCVar16 = (CleanupNode *)(-AVar4.align & (ulong)(pcVar2 + (AVar4.align - 1)));
  pCVar12 = (CleanupNode *)((long)&pCVar16->elem + n);
  if ((CleanupNode *)pSVar7->limit_ < pCVar12) goto LAB_00136122;
  (pSVar7->ptr_)._M_b._M_p = (__pointer_type)pCVar12;
  pCVar5 = (pSVar7->cleanup_list_).next_;
  if ((pSVar7->cleanup_list_).limit_ <= pCVar5) goto LAB_0013614b;
  (pSVar7->cleanup_list_).next_ = pCVar5 + 1;
  pCVar5->elem = pCVar16;
  pCVar5->destructor = destructor;
  while ((pCVar5 = (CleanupNode *)(pSVar7->cleanup_list_).prefetch_ptr_,
         pCVar5 != (CleanupNode *)0x0 && (pCVar5 < (CleanupNode *)(pSVar7->cleanup_list_).head_))) {
    pCStack_50 = (CleanupNode *)0x13614b;
    AllocateAlignedWithCleanup((ThreadSafeArena *)&stack0xffffffffffffffc0);
LAB_0013614b:
    pCStack_50 = (CleanupNode *)0x13615d;
    pCVar8 = pCVar16;
    cleanup::ChunkList::AddFallback(&pSVar7->cleanup_list_,pCVar16,destructor,pSVar7);
  }
  pCVar6 = (pSVar7->cleanup_list_).next_;
  destructor_00 = (CleanupNode *)((long)pCVar5 - (long)pCVar6);
  if (((long)destructor_00 < 0x181) &&
     (destructor_00 = (pSVar7->cleanup_list_).limit_, pCVar5 < destructor_00)) {
    if (pCVar6 < pCVar5) {
      pCVar6 = pCVar5;
    }
    pCVar5 = pCVar6;
    if (pCVar5 != (CleanupNode *)0x0) {
      if (pCVar5 + 0x18 < destructor_00) {
        destructor_00 = pCVar5 + 0x18;
      }
      for (; pCVar5 < destructor_00; pCVar5 = pCVar5 + 4) {
      }
      goto LAB_001360a8;
    }
LAB_001361e5:
    pCStack_50 = (CleanupNode *)0x1361ef;
    AllocateAlignedWithCleanup((ThreadSafeArena *)&stack0xffffffffffffffc0);
  }
  else {
LAB_001360a8:
    (pSVar7->cleanup_list_).prefetch_ptr_ = (char *)pCVar5;
    pCVar8 = (CleanupNode *)(pSVar7->ptr_)._M_b._M_p;
    pCVar5 = (CleanupNode *)pSVar7->limit_;
    if (pCVar5 < pCVar8) {
      pCStack_50 = (CleanupNode *)0x1361a5;
      AllocateAlignedWithCleanup();
      pCVar6 = extraout_RAX;
    }
    else {
      pCVar6 = (CleanupNode *)pSVar7->prefetch_ptr_;
      if ((pCVar6 != (CleanupNode *)0x0) &&
         (destructor_00 = (CleanupNode *)(pSVar7->head_)._M_b._M_p, pCVar6 < destructor_00)) {
        pCStack_50 = (CleanupNode *)0x1361e5;
        AllocateAlignedWithCleanup((ThreadSafeArena *)&stack0xffffffffffffffc0);
        goto LAB_001361e5;
      }
      destructor_00 = (CleanupNode *)((long)pCVar6 - (long)pCVar12);
      if (0x400 < (long)destructor_00) goto LAB_001360e8;
    }
    if (pCVar5 <= pCVar6) {
LAB_001360e8:
      pSVar7->prefetch_ptr_ = (char *)pCVar6;
      return pCVar16;
    }
    if (pCVar12 < pCVar6) {
      pCVar12 = pCVar6;
    }
    pCVar6 = pCVar12;
    pCVar12 = pCVar6;
    if (pCVar6 != (CleanupNode *)0x0) {
      if (pCVar6 + 0x40 < pCVar5) {
        pCVar5 = pCVar6 + 0x40;
      }
      for (; pCVar6 < pCVar5; pCVar6 = pCVar6 + 4) {
      }
      goto LAB_001360e8;
    }
  }
  this_00 = (ThreadSafeArena *)&stack0xffffffffffffffc0;
  pCStack_50 = (CleanupNode *)0x1361f9;
  AllocateAlignedWithCleanup(this_00);
  pSStack_78 = pSVar7;
  sStack_70 = align;
  uStack_68 = n;
  pCStack_60 = pCVar16;
  p_Stack_58 = destructor;
  pCStack_50 = pCVar12;
  pSVar7 = GetSerialArenaFallback(this_00,(size_t)(pCVar8 + 1));
  AVar4 = ArenaAlignAs(align_00);
  pcVar2 = (pSVar7->ptr_)._M_b._M_p;
  if (((ulong)pcVar2 & 7) != 0) {
    __assert_fail("false && \"ArenaAlignDefault::IsAligned(ptr)\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/arena_align.h"
                  ,0x90,
                  "auto google::protobuf::internal::ArenaAlign::CeilDefaultAligned(char *)::(anonymous class)::operator()() const"
                 );
  }
  n_00 = (ulong)((long)&pCVar8->elem + 7) & 0xfffffffffffffff8;
  pvVar17 = (void *)(-AVar4.align & (ulong)(pcVar2 + (AVar4.align - 1)));
  pAVar1 = (__pointer_type)((long)pvVar17 + n_00);
  if ((__pointer_type)pSVar7->limit_ < pAVar1) {
    pvVar17 = SerialArena::AllocateAlignedWithCleanupFallback
                        (pSVar7,n_00,align_00,(_func_void_void_ptr *)destructor_00);
    return pvVar17;
  }
  (pSVar7->ptr_)._M_b._M_p = (__pointer_type)pAVar1;
  pCVar8 = (pSVar7->cleanup_list_).next_;
  if (pCVar8 < (pSVar7->cleanup_list_).limit_) {
    (pSVar7->cleanup_list_).next_ = pCVar8 + 1;
    pCVar8->elem = pvVar17;
    pCVar8->destructor = (_func_void_void_ptr *)destructor_00;
  }
  else {
    cleanup::ChunkList::AddFallback
              (&pSVar7->cleanup_list_,pvVar17,(_func_void_void_ptr *)destructor_00,pSVar7);
  }
  pCVar8 = (CleanupNode *)(pSVar7->cleanup_list_).prefetch_ptr_;
  if ((pCVar8 != (CleanupNode *)0x0) && (pCVar8 < (CleanupNode *)(pSVar7->cleanup_list_).head_)) {
    pcVar15 = 
    "static_cast<const void*>(cleanup_list_.prefetch_ptr_) == nullptr || static_cast<const void*>(cleanup_list_.prefetch_ptr_) >= cleanup_list_.head_"
    ;
    uVar10 = 0x90;
    uVar11 = 0x137;
    goto LAB_00136431;
  }
  pCVar12 = (pSVar7->cleanup_list_).next_;
  if (((long)pCVar8 - (long)pCVar12 < 0x181) &&
     (pCVar16 = (pSVar7->cleanup_list_).limit_, pCVar8 < pCVar16)) {
    if (pCVar12 < pCVar8) {
      pCVar12 = pCVar8;
    }
    pCVar8 = pCVar12;
    if (pCVar8 != (CleanupNode *)0x0) {
      if (pCVar8 + 0x18 < pCVar16) {
        pCVar16 = pCVar8 + 0x18;
      }
      for (; pCVar8 < pCVar16; pCVar8 = pCVar8 + 4) {
      }
      goto LAB_001362a2;
    }
  }
  else {
LAB_001362a2:
    (pSVar7->cleanup_list_).prefetch_ptr_ = (char *)pCVar8;
    pAVar13 = (__pointer_type)(pSVar7->ptr_)._M_b._M_p;
    pAVar14 = (__pointer_type)pSVar7->limit_;
    if (pAVar14 < pAVar13) {
      psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<char_const*,char_const*>
                         ((char *)pAVar14,(char *)pAVar13,"limit_ >= ptr()");
      pcVar15 = *(char **)psVar9;
      uVar10 = *(undefined8 *)(psVar9 + 8);
      uVar11 = 0xf3;
      goto LAB_00136431;
    }
    pAVar13 = (__pointer_type)pSVar7->prefetch_ptr_;
    if ((pAVar13 != (__pointer_type)0x0) && (pAVar13 < (pSVar7->head_)._M_b._M_p)) {
      pcVar15 = 
      "static_cast<const void*>(prefetch_ptr_) == nullptr || static_cast<const void*>(prefetch_ptr_) >= head()"
      ;
      uVar10 = 0x67;
      uVar11 = 0x12e;
      goto LAB_00136431;
    }
    if ((0x400 < (long)pAVar13 - (long)pAVar1) || (pAVar14 <= pAVar13)) {
LAB_001362e2:
      pSVar7->prefetch_ptr_ = (char *)pAVar13;
      return pvVar17;
    }
    if (pAVar1 < pAVar13) {
      pAVar1 = pAVar13;
    }
    pAVar13 = pAVar1;
    if (pAVar13 != (__pointer_type)0x0) {
      if (pAVar13 + 0x40 < pAVar14) {
        pAVar14 = pAVar13 + 0x40;
      }
      for (; pAVar13 < pAVar14; pAVar13 = pAVar13 + 4) {
      }
      goto LAB_001362e2;
    }
  }
  pcVar15 = "prefetch_ptr != nullptr";
  uVar10 = 0x17;
  uVar11 = 0x123;
LAB_00136431:
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (aLStack_88,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/serial_arena.h"
             ,uVar11,uVar10,pcVar15);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_88);
}

Assistant:

void* ThreadSafeArena::AllocateAlignedWithCleanup(size_t n, size_t align,
                                                  void (*destructor)(void*)) {
  SerialArena* arena;
  if (PROTOBUF_PREDICT_TRUE(GetSerialArenaFast(&arena))) {
    return arena->AllocateAlignedWithCleanup(n, align, destructor);
  } else {
    return AllocateAlignedWithCleanupFallback(n, align, destructor);
  }
}